

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_trcddi.cpp
# Opt level: O1

ze_result_t
tracing_layer::zeDeviceGetP2PProperties
          (ze_device_handle_t hDevice,ze_device_handle_t hPeerDevice,
          ze_device_p2p_properties_t *pP2PProperties)

{
  _func_void__ze_device_get_p2_p_properties_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr *p_Var1;
  _func__ze_result_t__ze_device_handle_t_ptr__ze_device_handle_t_ptr__ze_device_p2p_properties_t_ptr
  *zeApiPtr;
  _ze_result_t _Var2;
  ze_result_t zVar3;
  char *pcVar4;
  ulong *puVar5;
  _ze_device_p2p_properties_t *in_RDX;
  long lVar6;
  _ze_device_handle_t *in_RSI;
  _ze_device_handle_t *in_RDI;
  ulong uVar7;
  APITracerCallbackDataImp<void_(*)(_ze_device_get_p2_p_properties_params_t_*,__ze_result_t,_void_*,_void_**)>
  apiCallbackData;
  APITracerCallbackStateImp<void_(*)(_ze_device_get_p2_p_properties_params_t_*,__ze_result_t,_void_*,_void_**)>
  epilogCallback;
  APITracerCallbackStateImp<void_(*)(_ze_device_get_p2_p_properties_params_t_*,__ze_result_t,_void_*,_void_**)>
  prologCallback;
  ze_device_get_p2_p_properties_params_t tracerParams;
  _ze_device_p2p_properties_t *local_f0;
  _ze_device_handle_t *local_e8;
  _ze_device_handle_t *local_e0;
  _func_void__ze_device_get_p2_p_properties_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
  *local_d8;
  vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_p2_p_properties_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_p2_p_properties_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
  vStack_d0;
  vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_p2_p_properties_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_p2_p_properties_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
  local_b8;
  vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_p2_p_properties_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_p2_p_properties_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
  local_98;
  vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_p2_p_properties_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_p2_p_properties_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
  local_80;
  APITracerCallbackStateImp<void_(*)(_ze_device_get_p2_p_properties_params_t_*,__ze_result_t,_void_*,_void_**)>
  local_68;
  APITracerCallbackStateImp<void_(*)(_ze_device_get_p2_p_properties_params_t_*,__ze_result_t,_void_*,_void_**)>
  local_58;
  _ze_device_get_p2_p_properties_params_t local_48;
  
  if (DAT_0017f268 ==
      (_func__ze_result_t__ze_device_handle_t_ptr__ze_device_handle_t_ptr__ze_device_p2p_properties_t_ptr
       *)0x0) {
    zVar3 = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    local_f0 = in_RDX;
    local_e8 = in_RSI;
    local_e0 = in_RDI;
    tracing_layer::tracingInProgress::__tls_init();
    pcVar4 = (char *)__tls_get_addr(&PTR_0017efa0);
    if (*pcVar4 != '\0') {
      _Var2 = (*DAT_0017f268)(local_e0,local_e8,local_f0);
      return _Var2;
    }
    tracing_layer::tracingInProgress::__tls_init();
    *pcVar4 = '\x01';
    local_48.phDevice = &local_e0;
    local_48.phPeerDevice = &local_e8;
    local_48.ppP2PProperties = &local_f0;
    local_b8.
    super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_p2_p_properties_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_p2_p_properties_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_b8.
    super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_p2_p_properties_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_p2_p_properties_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (APITracerCallbackStateImp<void_(*)(_ze_device_get_p2_p_properties_params_t_*,__ze_result_t,_void_*,_void_**)>
          *)0x0;
    vStack_d0.
    super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_p2_p_properties_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_p2_p_properties_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (APITracerCallbackStateImp<void_(*)(_ze_device_get_p2_p_properties_params_t_*,__ze_result_t,_void_*,_void_**)>
          *)0x0;
    vStack_d0.
    super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_p2_p_properties_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_p2_p_properties_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (APITracerCallbackStateImp<void_(*)(_ze_device_get_p2_p_properties_params_t_*,__ze_result_t,_void_*,_void_**)>
          *)0x0;
    local_d8 = (_func_void__ze_device_get_p2_p_properties_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
                *)0x0;
    vStack_d0.
    super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_p2_p_properties_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_p2_p_properties_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_b8.
    super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_p2_p_properties_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_p2_p_properties_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (APITracerCallbackStateImp<void_(*)(_ze_device_get_p2_p_properties_params_t_*,__ze_result_t,_void_*,_void_**)>
          *)0x0;
    puVar5 = (ulong *)(**(code **)(*pGlobalAPITracerContextImp + 0x10))();
    if ((puVar5 != (ulong *)0x0) && (*puVar5 != 0)) {
      lVar6 = 0;
      uVar7 = 0;
      do {
        local_58.current_api_callback =
             *(_func_void__ze_device_get_p2_p_properties_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
               **)(puVar5[1] + 0x138 + lVar6);
        p_Var1 = *(_func_void__ze_device_get_p2_p_properties_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
                   **)(puVar5[1] + 0x790 + lVar6);
        local_58.pUserData = *(void **)(puVar5[1] + 0xcb0 + lVar6);
        if (vStack_d0.
            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_p2_p_properties_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_p2_p_properties_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            vStack_d0.
            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_p2_p_properties_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_p2_p_properties_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_device_get_p2_p_properties_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_device_get_p2_p_properties_params_t*,_ze_result_t,void*,void**)>>>
          ::
          _M_realloc_insert<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_device_get_p2_p_properties_params_t*,_ze_result_t,void*,void**)>const&>
                    ((vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_device_get_p2_p_properties_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_device_get_p2_p_properties_params_t*,_ze_result_t,void*,void**)>>>
                      *)&vStack_d0,
                     (iterator)
                     vStack_d0.
                     super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_p2_p_properties_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_p2_p_properties_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&local_58);
        }
        else {
          (vStack_d0.
           super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_p2_p_properties_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_p2_p_properties_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)->current_api_callback =
               local_58.current_api_callback;
          (vStack_d0.
           super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_p2_p_properties_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_p2_p_properties_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)->pUserData = local_58.pUserData;
          vStack_d0.
          super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_p2_p_properties_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_p2_p_properties_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               vStack_d0.
               super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_p2_p_properties_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_p2_p_properties_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        local_68.pUserData = *(void **)(puVar5[1] + 0xcb0 + lVar6);
        local_68.current_api_callback = p_Var1;
        if (local_b8.
            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_p2_p_properties_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_p2_p_properties_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_b8.
            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_p2_p_properties_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_p2_p_properties_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_device_get_p2_p_properties_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_device_get_p2_p_properties_params_t*,_ze_result_t,void*,void**)>>>
          ::
          _M_realloc_insert<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_device_get_p2_p_properties_params_t*,_ze_result_t,void*,void**)>const&>
                    ((vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_device_get_p2_p_properties_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_device_get_p2_p_properties_params_t*,_ze_result_t,void*,void**)>>>
                      *)&local_b8,
                     (iterator)
                     local_b8.
                     super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_p2_p_properties_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_p2_p_properties_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&local_68);
        }
        else {
          (local_b8.
           super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_p2_p_properties_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_p2_p_properties_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)->current_api_callback = p_Var1;
          (local_b8.
           super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_p2_p_properties_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_p2_p_properties_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)->pUserData = local_68.pUserData;
          local_b8.
          super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_p2_p_properties_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_p2_p_properties_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_b8.
               super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_p2_p_properties_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_p2_p_properties_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        uVar7 = uVar7 + 1;
        lVar6 = lVar6 + 0xcb8;
      } while (uVar7 < *puVar5);
    }
    p_Var1 = local_d8;
    zeApiPtr = DAT_0017f268;
    std::
    vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_p2_p_properties_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_p2_p_properties_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ::vector(&local_80,&vStack_d0);
    std::
    vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_p2_p_properties_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_p2_p_properties_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ::vector(&local_98,&local_b8);
    zVar3 = APITracerWrapperImp<_ze_result_t(*)(_ze_device_handle_t*,_ze_device_handle_t*,_ze_device_p2p_properties_t*),_ze_device_get_p2_p_properties_params_t*,void(*)(_ze_device_get_p2_p_properties_params_t*,_ze_result_t,void*,void**),std::vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_device_get_p2_p_properties_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_device_get_p2_p_properties_params_t*,_ze_result_t,void*,void**)>>>,std::vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_device_get_p2_p_properties_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_device_get_p2_p_properties_params_t*,_ze_result_t,void*,void**)>>>,_ze_device_handle_t*&,_ze_device_handle_t*&,_ze_device_p2p_properties_t*&>
                      (zeApiPtr,&local_48,p_Var1,&local_80,&local_98,local_48.phDevice,
                       local_48.phPeerDevice,local_48.ppP2PProperties);
    if (local_98.
        super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_p2_p_properties_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_p2_p_properties_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_98.
                      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_p2_p_properties_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_p2_p_properties_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_98.
                            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_p2_p_properties_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_p2_p_properties_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_98.
                            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_p2_p_properties_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_p2_p_properties_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_80.
        super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_p2_p_properties_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_p2_p_properties_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_80.
                      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_p2_p_properties_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_p2_p_properties_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_80.
                            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_p2_p_properties_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_p2_p_properties_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_80.
                            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_p2_p_properties_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_p2_p_properties_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_b8.
        super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_p2_p_properties_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_p2_p_properties_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b8.
                      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_p2_p_properties_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_p2_p_properties_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_b8.
                            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_p2_p_properties_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_p2_p_properties_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_b8.
                            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_p2_p_properties_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_p2_p_properties_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (vStack_d0.
        super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_p2_p_properties_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_p2_p_properties_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(vStack_d0.
                      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_p2_p_properties_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_p2_p_properties_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)vStack_d0.
                            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_p2_p_properties_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_p2_p_properties_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)vStack_d0.
                            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_p2_p_properties_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_device_get_p2_p_properties_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return zVar3;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeDeviceGetP2PProperties(
        ze_device_handle_t hDevice,                     ///< [in] handle of the device performing the access
        ze_device_handle_t hPeerDevice,                 ///< [in] handle of the peer device with the allocation
        ze_device_p2p_properties_t* pP2PProperties      ///< [in,out] Peer-to-Peer properties between source and peer device
        )
    {
        auto pfnGetP2PProperties = context.zeDdiTable.Device.pfnGetP2PProperties;

        if( nullptr == pfnGetP2PProperties)
            return ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;

        ZE_HANDLE_TRACER_RECURSION(context.zeDdiTable.Device.pfnGetP2PProperties, hDevice, hPeerDevice, pP2PProperties);

        // capture parameters
        ze_device_get_p2_p_properties_params_t tracerParams = {
            &hDevice,
            &hPeerDevice,
            &pP2PProperties
        };

        tracing_layer::APITracerCallbackDataImp<ze_pfnDeviceGetP2PPropertiesCb_t> apiCallbackData;

        ZE_GEN_PER_API_CALLBACK_STATE(apiCallbackData, ze_pfnDeviceGetP2PPropertiesCb_t, Device, pfnGetP2PPropertiesCb);


        return tracing_layer::APITracerWrapperImp(context.zeDdiTable.Device.pfnGetP2PProperties,
                                                  &tracerParams,
                                                  apiCallbackData.apiOrdinal,
                                                  apiCallbackData.prologCallbacks,
                                                  apiCallbackData.epilogCallbacks,
                                                  *tracerParams.phDevice,
                                                  *tracerParams.phPeerDevice,
                                                  *tracerParams.ppP2PProperties);
    }